

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

bool __thiscall
HookStateStop::Start(HookStateStop *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  Debugger *this_00;
  EmmyDebuggerManager *pEVar1;
  shared_ptr<HookState> sStack_28;
  
  if (current != (lua_State *)0x0) {
    this_00 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pEVar1 = Debugger::GetEmmyDebuggerManager(this_00);
    std::__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HookStateContinue,void>
              ((__shared_ptr<HookState,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,
               &(pEVar1->stateContinue).
                super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>);
    Debugger::SetHookState(this_00,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return current != (lua_State *)0x0;
}

Assistant:

bool HookStateStop::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (current == nullptr)
		return false;

	// 不能取消当前hook
	// 当unity 停止play之后附加调试依然运行，此时lua虚拟机可能已经销毁
	// 所以以下操作会导致进程崩溃
	// debugger->UpdateHook(0, current);
	
	// 此处会引发递归加锁而报错，而如果使用递归锁对调试体验影响
	// debugger->DoAction(DebugAction::Continue);
	debugger->SetHookState(debugger->GetEmmyDebuggerManager()->stateContinue);

	return true;
}